

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementInstancer.cpp
# Opt level: O2

void Rml::Detail::ShutdownElementInstancerPools(void)

{
  ElementInstancerPools *pEVar1;
  
  pEVar1 = ControlledLifetimeResource<Rml::ElementInstancerPools>::operator->
                     ((ControlledLifetimeResource<Rml::ElementInstancerPools> *)
                      element_instancer_pools);
  if ((pEVar1->pool_text_default).num_allocated_objects == 0 &&
      (pEVar1->pool_element).num_allocated_objects == 0) {
    ControlledLifetimeResource<Rml::ElementInstancerPools>::Shutdown
              ((ControlledLifetimeResource<Rml::ElementInstancerPools> *)element_instancer_pools);
    return;
  }
  element_instancer_pools[0] = 1;
  return;
}

Assistant:

void Detail::ShutdownElementInstancerPools()
{
	if (element_instancer_pools->IsEmpty())
		element_instancer_pools.Shutdown();
	else
		element_instancer_pools.Leak();
}